

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkInfo.cpp
# Opt level: O2

void __thiscall LinkInfo::parseDriveType(LinkInfo *this)

{
  uint uVar1;
  ostream *poVar2;
  
  uVar1 = (this->VolumeID).DriveType.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_start[3];
  if (uVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_UNKNOWN");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"The drive type cannot be determined.");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = (this->VolumeID).DriveType.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[3];
  }
  if (uVar1 == 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_NO_ROOT_DIR");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "The root path is invalid; for example, there is no volume mounted at the path."
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = (this->VolumeID).DriveType.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[3];
  }
  if (uVar1 == 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_REMOVABLE");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "The drive has removable media, such as a floppy drive, thumb drive, or flash card reader."
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = (this->VolumeID).DriveType.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[3];
  }
  if (uVar1 == 3) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_FIXED");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "The drive has fixed media, such as a hard drive or flash drive.");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = (this->VolumeID).DriveType.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[3];
  }
  if (uVar1 == 4) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_REMOTE");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"The drive is a remote (network) drive.");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = (this->VolumeID).DriveType.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[3];
  }
  if (uVar1 == 5) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_CDROM");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"The drive is a CD-ROM drive.");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = (this->VolumeID).DriveType.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[3];
  }
  if (uVar1 == 6) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_RAMDISK");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"The drive is a RAM disk.");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  return;
}

Assistant:

void LinkInfo::parseDriveType() {
    if (VolumeID.DriveType[3] == DRIVE_UNKNOWN)
        cout << "DRIVE_UNKNOWN" << endl << Utils::defaultOffsetDocInfo <<
            "The drive type cannot be determined." << endl;
    if (VolumeID.DriveType[3] == DRIVE_NO_ROOT_DIR)
        cout << "DRIVE_NO_ROOT_DIR" << endl << Utils::defaultOffsetDocInfo <<
            "The root path is invalid; for example, there is no volume mounted at the path." << endl;
    if (VolumeID.DriveType[3] == DRIVE_REMOVABLE)
        cout << "DRIVE_REMOVABLE" << endl << Utils::defaultOffsetDocInfo <<
            "The drive has removable media, such as a floppy drive, thumb drive, or flash card reader." << endl;
    if (VolumeID.DriveType[3] == DRIVE_FIXED)
        cout << "DRIVE_FIXED" << endl << Utils::defaultOffsetDocInfo <<
            "The drive has fixed media, such as a hard drive or flash drive." << endl;
    if (VolumeID.DriveType[3] == DRIVE_REMOTE)
        cout << "DRIVE_REMOTE" << endl << Utils::defaultOffsetDocInfo <<
            "The drive is a remote (network) drive." << endl;
    if (VolumeID.DriveType[3] == DRIVE_CDROM)
        cout << "DRIVE_CDROM" << endl << Utils::defaultOffsetDocInfo <<
            "The drive is a CD-ROM drive." << endl;
    if (VolumeID.DriveType[3] == DRIVE_RAMDISK)
        cout << "DRIVE_RAMDISK" << endl << Utils::defaultOffsetDocInfo <<
            "The drive is a RAM disk." << endl;
}